

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O3

ArrayPtr<capnp::word> __thiscall
capnp::FlatMessageBuilder::allocateSegment(FlatMessageBuilder *this,uint minimumSize)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  _kjCondition.value = (bool)(this->allocated ^ 1);
  if (this->allocated == false) {
    this->allocated = true;
    return this->array;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[50]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
             ,0x12f,FAILED,"!allocated",
             "_kjCondition,\"FlatMessageBuilder\'s buffer was not large enough.\"",&_kjCondition,
             (char (*) [50])"FlatMessageBuilder\'s buffer was not large enough.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::ArrayPtr<word> FlatMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(!allocated, "FlatMessageBuilder's buffer was not large enough.");
  allocated = true;
  return array;
}